

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O0

FaceHandle __thiscall
OpenMesh::TriConnectivity::add_face
          (TriConnectivity *this,VertexHandle *_vertex_handles,size_t _vhs_size)

{
  BaseHandle *local_50;
  uint local_38;
  BaseHandle local_34;
  uint i;
  VertexHandle vhandles [3];
  size_t _vhs_size_local;
  VertexHandle *_vertex_handles_local;
  TriConnectivity *this_local;
  FaceHandle fh;
  
  if (_vhs_size < 3) {
    this_local._4_4_ = PolyConnectivity::InvalidFaceHandle;
  }
  else {
    vhandles._4_8_ = _vhs_size;
    if (_vhs_size == 3) {
      this_local._4_4_ =
           (int)PolyConnectivity::add_face(&this->super_PolyConnectivity,_vertex_handles,3);
    }
    else {
      local_50 = &local_34;
      do {
        VertexHandle::VertexHandle((VertexHandle *)local_50,-1);
        local_50 = local_50 + 1;
      } while (local_50 != &vhandles[1].super_BaseHandle);
      local_34.idx_ = (_vertex_handles->super_BaseHandle).idx_;
      FaceHandle::FaceHandle((FaceHandle *)((long)&this_local + 4),-1);
      local_38 = 1;
      vhandles._4_8_ = vhandles._4_8_ + -1;
      while ((ulong)local_38 < (ulong)vhandles._4_8_) {
        i = _vertex_handles[local_38].super_BaseHandle.idx_;
        local_38 = local_38 + 1;
        vhandles[0].super_BaseHandle.idx_ =
             (BaseHandle)_vertex_handles[local_38].super_BaseHandle.idx_;
        this_local._4_4_ =
             (int)PolyConnectivity::add_face
                            (&this->super_PolyConnectivity,(VertexHandle *)&local_34,3);
      }
    }
  }
  return (BaseHandle)(BaseHandle)this_local._4_4_;
}

Assistant:

TriConnectivity::FaceHandle
TriConnectivity::add_face(const VertexHandle* _vertex_handles, size_t _vhs_size)
{
  // need at least 3 vertices
  if (_vhs_size < 3) return InvalidFaceHandle;

  /// face is triangle -> ok
  if (_vhs_size == 3)
    return PolyConnectivity::add_face(_vertex_handles, _vhs_size);

  /// face is not a triangle -> triangulate
  else
  {
    //omlog() << "triangulating " << _vhs_size << "_gon\n";

    VertexHandle vhandles[3];
    vhandles[0] = _vertex_handles[0];

    FaceHandle fh;
    unsigned int i(1);
    --_vhs_size;

    while (i < _vhs_size)
    {
      vhandles[1] = _vertex_handles[i];
      vhandles[2] = _vertex_handles[++i];
      fh = PolyConnectivity::add_face(vhandles, 3);
    }

    return fh;
  }
}